

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openrpg.cpp
# Opt level: O3

int parse_args(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  undefined1 *puVar4;
  bool bVar5;
  int opt_ind;
  NameGenerator name;
  allocator local_1fa;
  allocator local_1f9;
  char *local_1f8 [2];
  char local_1e8 [20];
  int local_1d4;
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  string local_170 [16];
  undefined1 local_160 [16];
  string local_150 [16];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  string local_110 [16];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  ExpressionTree local_b0 [2];
  
  local_1d4 = 0;
  do {
    while (iVar1 = ORPG::Core::getopt_long(argc,argv,"hn:qr:vV",parse_args::long_opts,&local_1d4),
          iVar1 < 0x56) {
      if ((iVar1 != 0x3a) && (iVar1 != 0x3f)) {
        if (iVar1 == -1) {
          return -2;
        }
switchD_00103ca4_caseD_6f:
        parse_args();
        goto switchD_00103ca4_caseD_72;
      }
LAB_00103cca:
      ORPG::Core::PRINT_HELP_FLAG();
    }
    switch(iVar1) {
    case 0x6e:
      goto switchD_00103ca4_caseD_6e;
    case 0x6f:
    case 0x70:
    case 0x73:
    case 0x74:
    case 0x75:
      goto switchD_00103ca4_caseD_6f;
    case 0x71:
      ORPG::Core::QUIET_FLAG._0_1_ = 1;
      ORPG::Core::VB_FLAG._0_1_ = 0;
      break;
    case 0x72:
      goto switchD_00103ca4_caseD_72;
    case 0x76:
      ORPG::Core::VB_FLAG._0_1_ = 1;
      ORPG::Core::QUIET_FLAG._0_1_ = 0;
      break;
    default:
      if (iVar1 != 0x56) {
        if (iVar1 == 0x68) goto LAB_00103cca;
        goto switchD_00103ca4_caseD_6f;
      }
      ORPG::Core::PRINT_VERSION_FLAG();
    }
  } while( true );
switchD_00103ca4_caseD_72:
  ORPG::ExpressionTree::ExpressionTree(local_b0);
  std::__cxx11::string::string((string *)local_190,ORPG::Core::optarg,(allocator *)local_1f8);
  ORPG::ExpressionTree::set_expression(local_b0,local_190);
  if (local_190[0] != local_180) {
    operator_delete(local_190[0]);
  }
  uVar2 = ORPG::ExpressionTree::parse_expression(local_b0);
  printf("%i\n",(ulong)uVar2);
  goto LAB_00103ddf;
switchD_00103ca4_caseD_6e:
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"dwarf","");
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"");
  ORPG::NameGenerator::NameGenerator((NameGenerator *)local_b0,local_1b0,local_1d0);
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0]);
  }
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0]);
  }
  if (ORPG::Core::optind < argc) {
    std::__cxx11::string::string((string *)local_1f8,ORPG::Core::optarg,&local_1f9);
    iVar1 = std::__cxx11::string::compare((char *)local_1f8);
    bVar5 = true;
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)local_d0,ORPG::Core::optarg,&local_1fa);
      iVar1 = std::__cxx11::string::compare((char *)local_d0);
      bVar5 = iVar1 == 0;
      if (local_d0[0] != local_c0) {
        operator_delete(local_d0[0]);
      }
    }
    if (local_1f8[0] != local_1e8) {
      operator_delete(local_1f8[0]);
    }
    if (bVar5) {
      std::__cxx11::string::string((string *)local_f0,ORPG::Core::optarg,(allocator *)local_1f8);
      ORPG::NameGenerator::set_gender(local_b0,local_f0);
      if (local_f0[0] != local_e0) {
        operator_delete(local_f0[0]);
      }
      lVar3 = (long)ORPG::Core::optind;
      ORPG::Core::optind = ORPG::Core::optind + 1;
      std::__cxx11::string::string(local_110,argv[lVar3],(allocator *)local_1f8);
      ORPG::NameGenerator::set_race(local_b0,local_110);
      puVar4 = local_100;
    }
    else {
      std::__cxx11::string::string((string *)local_130,ORPG::Core::optarg,(allocator *)local_1f8);
      ORPG::NameGenerator::set_race(local_b0,local_130);
      if (local_130[0] != local_120) {
        operator_delete(local_130[0]);
      }
      lVar3 = (long)ORPG::Core::optind;
      ORPG::Core::optind = ORPG::Core::optind + 1;
      std::__cxx11::string::string(local_150,argv[lVar3],(allocator *)local_1f8);
      ORPG::NameGenerator::set_gender(local_b0,local_150);
      puVar4 = local_140;
    }
  }
  else {
    if (ORPG::Core::optind != argc) {
      fwrite("Error: invalid number of args (expects 1 or 2)\n",0x2f,1,_stderr);
      ORPG::Core::PRINT_HELP_FLAG();
      goto LAB_00103db8;
    }
    std::__cxx11::string::string(local_170,ORPG::Core::optarg,(allocator *)local_1f8);
    ORPG::NameGenerator::set_race(local_b0,local_170);
    puVar4 = local_160;
  }
  if (*(undefined1 **)(puVar4 + -0x10) != puVar4) {
    operator_delete(*(undefined1 **)(puVar4 + -0x10));
  }
LAB_00103db8:
  ORPG::NameGenerator::make_name_abi_cxx11_();
  puts(local_1f8[0]);
  std::__cxx11::string::~string((string *)local_1f8);
LAB_00103ddf:
  exit(0);
}

Assistant:

int parse_args(int argc, char* argv[]) {
    /* getopt_long stores the option and option index here */
    int opt = 0, opt_ind = 0;

    /* these are the long cla's and their corresponding chars */
    static struct Core::option long_opts[] = {
        {"help",    no_argument,        0,  'h'},
        {"name",    required_argument,  0,  'n'},
        {"quiet",   no_argument,        0,  'q'},
        {"roll",    required_argument,  0,  'r'},
        {"verbose", no_argument,        0,  'v'},
        {"version", no_argument,        0,  'V'},
        /* NULL row to terminate struct */
        {0,         0,                  0,   0}
    };

    while ((opt = getopt_long(argc, argv, "hn:qr:vV", long_opts, &opt_ind))
			!= EOF) {
        switch (opt) {
			/* -h --help */
			case 'h': {
				Core::PRINT_HELP_FLAG();
			} break;

			/* -n --name */
			case 'n': {
				NameGenerator name;

				if(Core::optind < argc) {
					if((string)Core::optarg == "male" || (string)Core::optarg == "female") {
                        name.set_gender((string)Core::optarg);
						name.set_race((string)argv[Core::optind++]);
					} else {
						name.set_race((string)Core::optarg);
						name.set_gender((string)argv[Core::optind++]);
					}
				} else if(Core::optind == argc) {
					name.set_race((string)Core::optarg);
				} else {
					fprintf(stderr, "Error: invalid number of args (expects 1 or 2)\n");
					Core::PRINT_HELP_FLAG();
				}
				printf("%s\n", name.make_name().c_str());
				exit(EXIT_SUCCESS);
			} break;

			/* -q --quiet */
			case 'q': {
				Core::QUIET_FLAG = true;
				Core::VB_FLAG = false;
			} break;

			/* -r --roll */
			case 'r': {
				ExpressionTree tree;
				tree.set_expression(Core::optarg);
				printf("%i\n", tree.parse_expression());
				exit(EXIT_SUCCESS);
			} break;

			/* -v --verbose */
			case 'v': {
				Core::VB_FLAG = true;
				Core::QUIET_FLAG = false;
			} break;

			/* -V --version */
			case 'V': {
				Core::PRINT_VERSION_FLAG();
			} break;

			case ':':
			case '?': {
				Core::PRINT_HELP_FLAG();
			} break;

			/* if we get here something very bad happened */
			default: {
				fprintf(stderr, "Aborting...\n");
				exit(EXIT_FAILURE);
			}
        }
    }

    return CONTINUE_CODE;
}